

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O3

void __thiscall ki::dml::Field<double>::Field(Field<double> *this,string *name)

{
  pointer pcVar1;
  size_t sVar2;
  string local_38;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  FieldBase::FieldBase(&this->super_FieldBase,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_FieldBase).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_write_to_0018c6a8;
  sVar2 = std::type_info::hash_code((type_info *)&double::typeinfo);
  (this->super_FieldBase).m_type_hash = sVar2;
  this->m_value = 0.0;
  return;
}

Assistant:

Field(std::string name) : FieldBase(name)
		{
			m_type_hash = typeid(ValueT).hash_code();
			m_value = ValueT();
		}